

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMeshFileLoader.cpp
# Opt level: O3

bool __thiscall
irr::scene::CXMeshFileLoader::parseDataObjectAnimationKey(CXMeshFileLoader *this,SJoint *joint)

{
  undefined1 *puVar1;
  long *plVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  bool bVar9;
  u32 uVar10;
  u32 uVar11;
  u32 uVar12;
  float *pfVar13;
  char *this_00;
  float fVar14;
  f32 fVar15;
  f32 fVar16;
  f32 fVar17;
  f32 fVar18;
  float fVar19;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  double __x_00;
  double extraout_XMM0_Qa_01;
  double __x_01;
  double __x_02;
  double extraout_XMM0_Qa_02;
  double __x_03;
  double __x_04;
  double extraout_XMM0_Qa_03;
  double __x_05;
  double __x_06;
  float fVar24;
  double extraout_XMM0_Qa_04;
  float fVar25;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  matrix4 mat;
  undefined1 local_b0 [40];
  float local_88;
  float local_80;
  float fStack_7c;
  float fStack_78;
  uint local_6c;
  string<char> local_68;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  bVar9 = readHeadOfDataObject(this,(stringc *)0x0);
  if (bVar9) {
    uVar10 = readInt(this);
    if (uVar10 < 5) {
      uVar11 = readInt(this);
      if (uVar11 == 0) {
        checkForOneFollowingSemicolons(this);
      }
      else {
        local_6c = uVar10 - 3;
        do {
          uVar12 = readInt(this);
          fVar14 = (float)uVar12;
          if (uVar10 - 1 < 2) {
            uVar12 = readInt(this);
            if (uVar12 != 3) {
              this_00 = "Expected 3 numbers in animation key in x file";
              __x = extraout_XMM0_Qa_02;
              goto LAB_001bb45d;
            }
            fVar15 = readFloat(this);
            fVar16 = readFloat(this);
            fVar29 = (float)readFloat(this);
            bVar9 = checkForTwoFollowingSemicolons(this);
            if (!bVar9) {
              os::Printer::log((Printer *)
                               "No finishing semicolon after vector animation key in x file",__x_03)
              ;
              core::string<char>::string((string<char> *)local_b0,this->Line);
              os::Printer::log(__x_04);
              if ((undefined1 *)CONCAT44(local_b0._4_4_,local_b0._0_4_) != local_b0 + 0x10) {
                operator_delete((undefined1 *)CONCAT44(local_b0._4_4_,local_b0._0_4_),
                                CONCAT44(local_b0._20_4_,local_b0._16_4_) + 1);
              }
            }
            plVar2 = *(long **)&(this->super_IMeshLoader).field_0x8;
            lVar3 = *plVar2;
            if (uVar10 == 2) {
              pfVar13 = (float *)(**(code **)(lVar3 + 0x108))();
            }
            else {
              pfVar13 = (float *)(**(code **)(lVar3 + 0x110))(plVar2,joint);
            }
            *pfVar13 = fVar14;
            pfVar13[1] = (float)fVar15;
            pfVar13[2] = (float)fVar16;
LAB_001bbb1d:
            pfVar13[3] = fVar29;
          }
          else {
            if (local_6c < 2) {
              uVar12 = readInt(this);
              if (uVar12 == 0x10) {
                readMatrix(this,(matrix4 *)local_b0);
                bVar9 = checkForOneFollowingSemicolons(this);
                if (!bVar9) {
                  os::Printer::log((Printer *)
                                   "No finishing semicolon after matrix animation key in x file",
                                   __x_01);
                  core::string<char>::string(&local_68,this->Line);
                  os::Printer::log(__x_02);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_68.str._M_dataplus._M_p != &local_68.str.field_2) {
                    operator_delete(local_68.str._M_dataplus._M_p,
                                    local_68.str.field_2._M_allocated_capacity + 1);
                  }
                }
                plVar2 = *(long **)&(this->super_IMeshLoader).field_0x8;
                pfVar13 = (float *)(**(code **)(*plVar2 + 0x118))(plVar2,joint);
                uVar8 = local_b0._24_4_;
                uVar7 = local_b0._16_4_;
                uVar6 = local_b0._8_4_;
                uVar5 = local_b0._4_4_;
                *pfVar13 = fVar14;
                fVar29 = (float)local_b0._0_4_ + (float)local_b0._20_4_ + local_88 + 1.0;
                fVar19 = (float)local_b0._32_8_;
                fVar24 = SUB84(local_b0._32_8_,4);
                if (fVar29 <= 0.0) {
                  if (((float)local_b0._0_4_ <= (float)local_b0._20_4_) ||
                     ((float)local_b0._0_4_ <= local_88)) {
                    if ((float)local_b0._20_4_ <= local_88) {
                      fVar29 = ((local_88 + 1.0) - (float)local_b0._0_4_) - (float)local_b0._20_4_;
                      if (fVar29 < 0.0) {
                        fVar29 = sqrtf(fVar29);
                      }
                      else {
                        fVar29 = SQRT(fVar29);
                      }
                      auVar21._0_4_ = fVar29 + fVar29;
                      auVar30._0_4_ = fVar19 + (float)uVar6;
                      auVar30._4_4_ = fVar24 + (float)uVar8;
                      auVar30._8_4_ = auVar21._0_4_;
                      auVar30._12_4_ = (float)uVar7 - (float)uVar5;
                      auVar21._4_4_ = auVar21._0_4_;
                      auVar21._8_4_ = 0x3e800000;
                      auVar21._12_4_ = auVar21._0_4_;
                      auVar30 = divps(auVar30,auVar21);
                      auVar22._8_4_ = auVar21._0_4_ * 0.25;
                      auVar22._0_8_ = auVar30._0_8_;
                      auVar22._12_4_ = auVar30._12_4_;
                    }
                    else {
                      fVar29 = (((float)local_b0._20_4_ + 1.0) - (float)local_b0._0_4_) - local_88;
                      if (fVar29 < 0.0) {
                        fVar29 = sqrtf(fVar29);
                      }
                      else {
                        fVar29 = SQRT(fVar29);
                      }
                      auVar23._0_4_ = fVar29 + fVar29;
                      auVar28._4_4_ = 0x3e800000;
                      auVar28._0_4_ = (float)uVar7 + (float)uVar5;
                      auVar28._8_4_ = fVar24 + (float)uVar8;
                      auVar28._12_4_ = (float)uVar6 - fVar19;
                      auVar23._4_4_ = auVar23._0_4_;
                      auVar23._8_4_ = auVar23._0_4_;
                      auVar23._12_4_ = auVar23._0_4_;
                      auVar21 = divps(auVar28,auVar23);
                      auVar22._4_4_ = auVar23._0_4_ * 0.25;
                      auVar22._0_4_ = (float)auVar21._0_4_;
                      auVar22._8_4_ = auVar21._8_4_;
                      auVar22._12_4_ = auVar21._12_4_;
                    }
                  }
                  else {
                    fVar29 = (((float)local_b0._0_4_ + 1.0) - (float)local_b0._20_4_) - local_88;
                    if (fVar29 < 0.0) {
                      fVar29 = sqrtf(fVar29);
                    }
                    else {
                      fVar29 = SQRT(fVar29);
                    }
                    fVar29 = fVar29 + fVar29;
                    auVar31._0_4_ = (float)uVar5 + (float)uVar7;
                    auVar31._4_4_ = (float)uVar5 + (float)uVar7;
                    auVar31._8_4_ = (float)uVar6 + fVar19;
                    auVar31._12_4_ = fVar24 - (float)uVar8;
                    auVar27._4_4_ = fVar29;
                    auVar27._0_4_ = fVar29;
                    auVar27._8_4_ = fVar29;
                    auVar27._12_4_ = fVar29;
                    auVar21 = divps(auVar31,auVar27);
                    auVar22._0_4_ = fVar29 * 0.25;
                    auVar22._4_4_ = (float)auVar21._4_4_;
                    auVar22._8_4_ = auVar21._8_4_;
                    auVar22._12_4_ = auVar21._12_4_;
                  }
                }
                else {
                  if (fVar29 < 0.0) {
                    fVar29 = sqrtf(fVar29);
                  }
                  else {
                    fVar29 = SQRT(fVar29);
                  }
                  auVar20._0_4_ = fVar24 - (float)uVar8;
                  auVar20._4_4_ = (float)uVar6 - fVar19;
                  auVar20._8_4_ = (float)uVar7 - (float)uVar5;
                  auVar20._12_4_ = fVar24 - (float)uVar6;
                  fVar29 = fVar29 + fVar29;
                  auVar4._4_4_ = fVar29;
                  auVar4._0_4_ = fVar29;
                  auVar4._8_4_ = fVar29;
                  auVar4._12_4_ = 0x3e800000;
                  auVar21 = divps(auVar20,auVar4);
                  auVar22._0_12_ = auVar21._0_12_;
                  auVar22._12_4_ = fVar29 * 0.25;
                }
                fVar19 = auVar22._0_4_;
                fVar24 = auVar22._4_4_;
                fVar25 = auVar22._8_4_;
                fVar26 = auVar22._12_4_;
                fVar29 = 1.0 / SQRT(fVar26 * fVar26 +
                                    fVar25 * fVar25 + fVar19 * fVar19 + fVar24 * fVar24);
                pfVar13[1] = fVar29 * fVar19;
                pfVar13[2] = fVar29 * fVar24;
                pfVar13[3] = fVar29 * fVar25;
                pfVar13[4] = fVar29 * fVar26;
                plVar2 = *(long **)&(this->super_IMeshLoader).field_0x8;
                pfVar13 = (float *)(**(code **)(*plVar2 + 0x108))(plVar2,joint);
                *pfVar13 = fVar14;
                pfVar13[1] = local_80;
                pfVar13[2] = fStack_7c;
                fVar29 = fStack_78;
                goto LAB_001bbb1d;
              }
              this_00 = "Expected 16 numbers in animation key in x file";
              __x = extraout_XMM0_Qa_01;
              goto LAB_001bb45d;
            }
            uVar12 = readInt(this);
            if (uVar12 != 4) {
              this_00 = "Expected 4 numbers in animation key in x file";
              __x = extraout_XMM0_Qa_03;
              goto LAB_001bb45d;
            }
            fVar15 = readFloat(this);
            fVar16 = readFloat(this);
            fVar17 = readFloat(this);
            fVar18 = readFloat(this);
            bVar9 = checkForTwoFollowingSemicolons(this);
            if (!bVar9) {
              os::Printer::log((Printer *)
                               "No finishing semicolon after quaternion animation key in x file",
                               __x_05);
              core::string<char>::string((string<char> *)local_b0,this->Line);
              os::Printer::log(__x_06);
              if ((undefined1 *)CONCAT44(local_b0._4_4_,local_b0._0_4_) != local_b0 + 0x10) {
                operator_delete((undefined1 *)CONCAT44(local_b0._4_4_,local_b0._0_4_),
                                CONCAT44(local_b0._20_4_,local_b0._16_4_) + 1);
              }
            }
            local_48 = -(float)fVar16;
            fStack_44 = -(float)fVar17;
            fStack_40 = -(float)fVar18;
            fStack_3c = -(float)fVar15;
            plVar2 = *(long **)&(this->super_IMeshLoader).field_0x8;
            pfVar13 = (float *)(**(code **)(*plVar2 + 0x118))(plVar2,joint);
            fVar29 = 1.0 / SQRT((float)fVar15 * (float)fVar15 +
                                (float)fVar18 * (float)fVar18 +
                                (float)fVar16 * (float)fVar16 + (float)fVar17 * (float)fVar17);
            *pfVar13 = fVar14;
            pfVar13[1] = fVar29 * local_48;
            pfVar13[2] = fVar29 * fStack_44;
            pfVar13[3] = fVar29 * fStack_40;
            pfVar13[4] = fVar29 * fStack_3c;
          }
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
      }
      bVar9 = checkForOneFollowingSemicolons(this);
      if (!bVar9) {
        puVar1 = &(this->super_IMeshLoader).field_0x18;
        *(long *)puVar1 = *(long *)puVar1 + -1;
      }
      bVar9 = checkForClosingBrace(this);
      if (bVar9) {
        return true;
      }
      this_00 = "No closing brace in animation key in x file";
      __x = extraout_XMM0_Qa_04;
    }
    else {
      this_00 = "Unknown key type found in Animation Key in x file";
      __x = extraout_XMM0_Qa_00;
    }
  }
  else {
    this_00 = "No opening brace in Animation Key found in x file";
    __x = extraout_XMM0_Qa;
  }
LAB_001bb45d:
  os::Printer::log((Printer *)this_00,__x);
  core::string<char>::string((string<char> *)local_b0,this->Line);
  os::Printer::log(__x_00);
  if ((undefined1 *)CONCAT44(local_b0._4_4_,local_b0._0_4_) != local_b0 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_b0._4_4_,local_b0._0_4_),
                    CONCAT44(local_b0._20_4_,local_b0._16_4_) + 1);
  }
  this->ErrorState = true;
  return false;
}

Assistant:

bool CXMeshFileLoader::parseDataObjectAnimationKey(ISkinnedMesh::SJoint *joint)
{
#ifdef _XREADER_DEBUG
	os::Printer::log("CXFileReader: reading animation key", ELL_DEBUG);
#endif

	if (!readHeadOfDataObject()) {
		os::Printer::log("No opening brace in Animation Key found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		SET_ERR_AND_RETURN();
	}

	// read key type

	const u32 keyType = readInt();

	if (keyType > 4) {
		os::Printer::log("Unknown key type found in Animation Key in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		SET_ERR_AND_RETURN();
	}

	// read number of keys
	const u32 numberOfKeys = readInt();

	// eat the semicolon after the "0".  if there are keys present, readInt()
	// does this for us.  If there aren't, we need to do it explicitly
	if (numberOfKeys == 0)
		checkForOneFollowingSemicolons();

	for (u32 i = 0; i < numberOfKeys; ++i) {
		// read time
		const f32 time = (f32)readInt();

		// read keys
		switch (keyType) {
		case 0: // rotation
		{
			// read quaternions

			// read count
			if (readInt() != 4) {
				os::Printer::log("Expected 4 numbers in animation key in x file", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
				SET_ERR_AND_RETURN();
			}

			f32 W = -readFloat();
			f32 X = -readFloat();
			f32 Y = -readFloat();
			f32 Z = -readFloat();

			if (!checkForTwoFollowingSemicolons()) {
				os::Printer::log("No finishing semicolon after quaternion animation key in x file", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
			}

			ISkinnedMesh::SRotationKey *key = AnimatedMesh->addRotationKey(joint);
			key->frame = time;
			key->rotation.set(X, Y, Z, W);
			key->rotation.normalize();
		} break;
		case 1: // scale
		case 2: // position
		{
			// read vectors

			// read count
			if (readInt() != 3) {
				os::Printer::log("Expected 3 numbers in animation key in x file", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
				SET_ERR_AND_RETURN();
			}

			core::vector3df vector;
			readVector3(vector);

			if (!checkForTwoFollowingSemicolons()) {
				os::Printer::log("No finishing semicolon after vector animation key in x file", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
			}

			if (keyType == 2) {
				ISkinnedMesh::SPositionKey *key = AnimatedMesh->addPositionKey(joint);
				key->frame = time;
				key->position = vector;
			} else {
				ISkinnedMesh::SScaleKey *key = AnimatedMesh->addScaleKey(joint);
				key->frame = time;
				key->scale = vector;
			}
		} break;
		case 3:
		case 4: {
			// read matrix

			// read count
			if (readInt() != 16) {
				os::Printer::log("Expected 16 numbers in animation key in x file", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
				SET_ERR_AND_RETURN();
			}

			// read matrix
			core::matrix4 mat(core::matrix4::EM4CONST_NOTHING);
			readMatrix(mat);

			// mat=joint->LocalMatrix*mat;

			if (!checkForOneFollowingSemicolons()) {
				os::Printer::log("No finishing semicolon after matrix animation key in x file", ELL_WARNING);
				os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
			}

			// core::vector3df rotation = mat.getRotationDegrees();

			ISkinnedMesh::SRotationKey *keyR = AnimatedMesh->addRotationKey(joint);
			keyR->frame = time;

			// IRR_TEST_BROKEN_QUATERNION_USE: TODO - switched from mat to mat.getTransposed() for downward compatibility.
			// Not tested so far if this was correct or wrong before quaternion fix!
			keyR->rotation = core::quaternion(mat.getTransposed());

			ISkinnedMesh::SPositionKey *keyP = AnimatedMesh->addPositionKey(joint);
			keyP->frame = time;
			keyP->position = mat.getTranslation();

			/*
							core::vector3df scale=mat.getScale();

							if (scale.X==0)
								scale.X=1;
							if (scale.Y==0)
								scale.Y=1;
							if (scale.Z==0)
								scale.Z=1;
							ISkinnedMesh::SScaleKey *keyS=AnimatedMesh->addScaleKey(joint);
							keyS->frame=time;
							keyS->scale=scale;
			*/
		} break;
		} // end switch
	}

	if (!checkForOneFollowingSemicolons())
		--P;

	if (!checkForClosingBrace()) {
		os::Printer::log("No closing brace in animation key in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		SET_ERR_AND_RETURN();
	}

	return true;
}